

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_NoiseBox.cpp
# Opt level: O1

int NoiseBox::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x100);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Add Amount","dB",-100.0,0.0,-50.0,1.0,1.0,0,
                    "Gain of additive noise in dB");
  RegisterParameter(definition,"Mul Amount","dB",-100.0,0.0,-50.0,1.0,1.0,1,
                    "Gain of multiplicative noise in dB");
  RegisterParameter(definition,"Add Frequency","Hz",0.001,24000.0,5000.0,1.0,3.0,2,
                    "Additive noise frequency cutoff in Hz");
  RegisterParameter(definition,"Mul Frequency","Hz",0.001,24000.0,50.0,1.0,3.0,3,
                    "Multiplicative noise frequency cutoff in Hz");
  return 4;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Add Amount", "dB", -100.0f, 0.0f, -50.0f, 1.0f, 1.0f, P_ADDAMT, "Gain of additive noise in dB");
        RegisterParameter(definition, "Mul Amount", "dB", -100.0f, 0.0f, -50.0f, 1.0f, 1.0f, P_MULAMT, "Gain of multiplicative noise in dB");
        RegisterParameter(definition, "Add Frequency", "Hz", 0.001f, 24000.0f, 5000.0f, 1.0f, 3.0f, P_ADDFREQ, "Additive noise frequency cutoff in Hz");
        RegisterParameter(definition, "Mul Frequency", "Hz", 0.001f, 24000.0f, 50.0f, 1.0f, 3.0f, P_MULFREQ, "Multiplicative noise frequency cutoff in Hz");
        return numparams;
    }